

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

bool goodform::is<long>(any *v)

{
  char *__s1;
  int iVar1;
  type_info *ptVar2;
  bool bVar3;
  
  ptVar2 = std::any::type(v);
  __s1 = *(char **)(ptVar2 + 8);
  if (__s1 == _getline<char,std::char_traits<char>,std::allocator<char>>) {
    bVar3 = true;
  }
  else if (*__s1 == '*') {
    bVar3 = false;
  }
  else {
    iVar1 = strcmp(__s1,_getline<char,std::char_traits<char>,std::allocator<char>>);
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool is(const any& v)
  {
    return v.type() == typeid(T);
  }